

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Edits::Iterator::sourceIndexFromDestinationIndex
          (Iterator *this,int32_t i,UErrorCode *errorCode)

{
  int32_t iVar1;
  int32_t where;
  UErrorCode *errorCode_local;
  int32_t i_local;
  Iterator *this_local;
  
  iVar1 = findIndex(this,i,'\0',errorCode);
  if (iVar1 < 0) {
    this_local._4_4_ = 0;
  }
  else if ((iVar1 < 1) && (i != this->destIndex)) {
    if (this->changed == '\0') {
      this_local._4_4_ = this->srcIndex + (i - this->destIndex);
    }
    else {
      this_local._4_4_ = this->srcIndex + this->oldLength_;
    }
  }
  else {
    this_local._4_4_ = this->srcIndex;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Edits::Iterator::sourceIndexFromDestinationIndex(int32_t i, UErrorCode &errorCode) {
    int32_t where = findIndex(i, FALSE, errorCode);
    if (where < 0) {
        // Error or before the string.
        return 0;
    }
    if (where > 0 || i == destIndex) {
        // At or after string length, or at start of the found span.
        return srcIndex;
    }
    if (changed) {
        // In a change span, map to its end.
        return srcIndex + oldLength_;
    } else {
        // In an unchanged span, offset within it.
        return srcIndex + (i - destIndex);
    }
}